

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddGroupSiftingDown(DdManager *table,int x,int xHigh,DD_CHKFP checkFunction,Move **moves)

{
  int x_00;
  uint uVar1;
  Move *pMVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  DdNode *pDVar6;
  uint local_64;
  int zindex;
  int z;
  int allVars;
  int isolated;
  int yindex;
  int xindex;
  int R;
  int gybot;
  int gxtop;
  int limitSize;
  int size;
  int y;
  Move *move;
  Move **moves_local;
  DD_CHKFP checkFunction_local;
  int xHigh_local;
  int x_local;
  DdManager *table_local;
  
  bVar3 = true;
  limitSize = x;
  do {
    if (table->subtables[limitSize].keys != 1) {
      bVar3 = false;
      break;
    }
    limitSize = table->subtables[limitSize].next;
  } while (table->subtables[limitSize].next != x);
  if (!bVar3) {
    x_00 = table->invperm[x];
    uVar1 = table->subtables[x].next;
    gybot = table->keys - table->isolated;
    yindex = 0;
    for (local_64 = xHigh; (int)uVar1 < (int)local_64; local_64 = local_64 + -1) {
      iVar5 = table->invperm[(int)local_64];
      if ((iVar5 == x_00) || (iVar4 = cuddTestInteract(table,x_00,iVar5), iVar4 != 0)) {
        yindex = (table->subtables[(int)local_64].keys - (uint)(table->vars[iVar5]->ref == 1)) +
                 yindex;
      }
    }
    limitSize = cuddNextHigh(table,x);
    gxtop = gybot;
    checkFunction_local._4_4_ = x;
    while (limitSize <= xHigh && gxtop - yindex < gybot) {
      xindex = table->subtables[limitSize].next;
      while (table->subtables[xindex].next != limitSize) {
        xindex = table->subtables[xindex].next;
      }
      iVar5 = (*checkFunction)(table,checkFunction_local._4_4_,limitSize);
      if (iVar5 == 0) {
        if ((table->subtables[(int)checkFunction_local._4_4_].next == checkFunction_local._4_4_) &&
           (table->subtables[limitSize].next == limitSize)) {
          iVar5 = table->invperm[limitSize];
          iVar4 = cuddTestInteract(table,x_00,iVar5);
          if (iVar4 != 0) {
            yindex = yindex - (table->subtables[limitSize].keys -
                              (uint)(table->vars[iVar5]->ref == 1));
          }
          gxtop = cuddSwapInPlace(table,checkFunction_local._4_4_,limitSize);
          if ((gxtop == 0) || (pDVar6 = cuddDynamicAllocNode(table), pDVar6 == (DdNode *)0x0))
          goto LAB_00c026d0;
          pDVar6->index = checkFunction_local._4_4_;
          pDVar6->ref = limitSize;
          *(undefined4 *)&pDVar6->next = 0;
          *(int *)((long)&pDVar6->next + 4) = gxtop;
          (pDVar6->type).kids.T = (DdNode *)*moves;
          *moves = (Move *)pDVar6;
          if ((double)gybot * table->maxGrowth < (double)gxtop) {
            return 1;
          }
          if (gxtop < gybot) {
            gybot = gxtop;
          }
          cuddNextHigh(table,limitSize);
        }
        else {
          local_64 = table->subtables[(int)checkFunction_local._4_4_].next + 1;
          do {
            iVar5 = table->invperm[(int)local_64];
            if ((iVar5 == x_00) || (iVar4 = cuddTestInteract(table,x_00,iVar5), iVar4 != 0)) {
              yindex = yindex - (table->subtables[(int)local_64].keys -
                                (uint)(table->vars[iVar5]->ref == 1));
            }
            local_64 = local_64 + 1;
          } while ((int)local_64 <= xindex);
          gxtop = ddGroupMove(table,checkFunction_local._4_4_,limitSize,moves);
          if (gxtop == 0) {
LAB_00c026d0:
            while (*moves != (Move *)0x0) {
              pMVar2 = (*moves)->next;
              (*moves)->y = 0;
              *(DdNode **)&(*moves)->flags = table->nextFree;
              table->nextFree = (DdNode *)*moves;
              *moves = pMVar2;
            }
            return 0;
          }
          if ((double)gybot * table->maxGrowth < (double)gxtop) {
            return 1;
          }
          if (gxtop < gybot) {
            gybot = gxtop;
          }
          local_64 = table->subtables[xindex].next;
          while (local_64 = local_64 + 1, (int)local_64 <= xindex) {
            iVar5 = table->invperm[(int)local_64];
            if ((iVar5 == x_00) || (iVar4 = cuddTestInteract(table,x_00,iVar5), iVar4 != 0)) {
              yindex = (table->subtables[(int)local_64].keys - (uint)(table->vars[iVar5]->ref == 1))
                       + yindex;
            }
          }
        }
      }
      else {
        uVar1 = table->subtables[(int)checkFunction_local._4_4_].next;
        table->subtables[(int)checkFunction_local._4_4_].next = limitSize;
        table->subtables[xindex].next = uVar1;
        pDVar6 = cuddDynamicAllocNode(table);
        if (pDVar6 == (DdNode *)0x0) goto LAB_00c026d0;
        pDVar6->index = checkFunction_local._4_4_;
        pDVar6->ref = limitSize;
        *(undefined4 *)&pDVar6->next = 8;
        *(uint *)((long)&pDVar6->next + 4) = table->keys - table->isolated;
        (pDVar6->type).kids.T = (DdNode *)*moves;
        *moves = (Move *)pDVar6;
      }
      checkFunction_local._4_4_ = xindex;
      limitSize = cuddNextHigh(table,xindex);
    }
  }
  return 1;
}

Assistant:

static int
ddGroupSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh,
  DD_CHKFP checkFunction,
  Move ** moves)
{
    Move *move;
    int  y;
    int  size;
    int  limitSize;
    int  gxtop,gybot;
    int  R;     /* upper bound on node decrease */
    int  xindex, yindex;
    int  isolated, allVars;
    int  z;
    int  zindex;
#ifdef DD_DEBUG
    int  checkR;
#endif

    /* If the group consists of simple variables, there is no point in
    ** sifting it down. This check is redundant if the projection functions
    ** do not have external references, because the computation of the
    ** lower bound takes care of the problem.  It is necessary otherwise to
    ** prevent the sifting down of simple variables. */
    y = x;
    allVars = 1;
    do {
        if (table->subtables[y].keys != 1) {
            allVars = 0;
            break;
        }
        y = table->subtables[y].next;
    } while (table->subtables[y].next != (unsigned) x);
    if (allVars)
        return(1);

    /* Initialize R. */
    xindex = table->invperm[x];
    gxtop = table->subtables[x].next;
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (z = xHigh; z > gxtop; z--) {
        zindex = table->invperm[z];
        if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
            isolated = table->vars[zindex]->ref == 1;
            R += table->subtables[z].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        gxtop = table->subtables[x].next;
        checkR = 0;
        for (z = xHigh; z > gxtop; z--) {
            zindex = table->invperm[z];
            if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        assert(R >= checkR);
#endif
        /* Find bottom of y group. */
        gybot = table->subtables[y].next;
        while (table->subtables[gybot].next != (unsigned) y)
            gybot = table->subtables[gybot].next;

        if (checkFunction(table,x,y)) {
            /* Group found: attach groups and record move. */
            gxtop = table->subtables[x].next;
            table->subtables[x].next = y;
            table->subtables[gybot].next = gxtop;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_NEWNODE;
            move->size = table->keys - table->isolated;
            move->next = *moves;
            *moves = move;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y are self groups */
            /* Update upper bound on node decrease. */
            yindex = table->invperm[y];
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[yindex]->ref == 1;
                R -= table->subtables[y].keys - isolated;
            }
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddGroupSiftingDownOutOfMem;

            /* Record move. */
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingDownOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,
                                       "ddGroupSiftingDown (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;

            x = y;
            y = cuddNextHigh(table,x);
        } else { /* Group move */
            /* Update upper bound on node decrease: first phase. */
            gxtop = table->subtables[x].next;
            z = gxtop + 1;
            do {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R -= table->subtables[z].keys - isolated;
                }
                z++;
            } while (z <= gybot);
            size = ddGroupMove(table,x,y,moves);
            if (size == 0) goto ddGroupSiftingDownOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;

            /* Update upper bound on node decrease: second phase. */
            gxtop = table->subtables[gybot].next;
            for (z = gxtop + 1; z <= gybot; z++) {
                zindex = table->invperm[z];
                if (zindex == xindex || cuddTestInteract(table,xindex,zindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    R += table->subtables[z].keys - isolated;
                }
            }
        }
        x = gybot;
        y = cuddNextHigh(table,x);
    }

    return(1);

ddGroupSiftingDownOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }

    return(0);

}